

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

double __thiscall r_exec::View::update_act(View *this,double low,double high)

{
  Atom *this_00;
  float fVar1;
  double dVar2;
  float local_54;
  double act;
  Atom local_2c [4];
  double local_28;
  double new_act;
  double high_local;
  double low_local;
  View *this_local;
  
  new_act = high;
  high_local = low;
  low_local = (double)this;
  if ((this->act_changes != 0) && ((this->acc_act != 0.0 || (NAN(this->acc_act))))) {
    fVar1 = get_act(this);
    local_54 = (float)this->act_changes;
    local_28 = (double)(fVar1 + this->acc_act / local_54);
    if (0.0 <= local_28) {
      if (1.0 < local_28) {
        local_28 = 1.0;
      }
    }
    else {
      local_28 = 0.0;
    }
    r_code::Atom::Float((float)local_28);
    this_00 = r_code::View::code(&this->super_View,7);
    r_code::Atom::operator=(this_00,local_2c);
    r_code::Atom::~Atom(local_2c);
  }
  this->acc_act = 0.0;
  this->act_changes = 0;
  fVar1 = get_act(this);
  dVar2 = (double)fVar1;
  if (high_local <= dVar2) {
    this->periods_at_low_act = 0;
    if (dVar2 <= new_act) {
      this->periods_at_high_act = 0;
    }
    else {
      this->periods_at_high_act = this->periods_at_high_act + 1;
    }
  }
  else {
    this->periods_at_low_act = this->periods_at_low_act + 1;
  }
  return dVar2;
}

Assistant:

double View::update_act(double low, double high)
{
    if (act_changes > 0 && acc_act != 0) {
        double new_act = get_act() + acc_act / act_changes;

        if (new_act < 0) {
            new_act = 0;
        } else if (new_act > 1) {
            new_act = 1;
        }

        code(VIEW_ACT) = r_code::Atom::Float(new_act);
    }

    acc_act = 0;
    act_changes = 0;
    double act = get_act();

    if (act < low) {
        ++periods_at_low_act;
    } else {
        periods_at_low_act = 0;

        if (act > high) {
            ++periods_at_high_act;
        } else {
            periods_at_high_act = 0;
        }
    }

    return act;
}